

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O0

mpc_val_t * mpcaf_grammar_id(mpc_val_t *x,void *s)

{
  mpc_parser_t *t;
  mpc_parser_t *in_RSI;
  void *in_RDI;
  mpc_parser_t *p;
  mpca_grammar_st_t *st;
  mpca_grammar_st_t *in_stack_00000020;
  char *in_stack_00000028;
  mpc_parser_t *local_8;
  
  t = mpca_grammar_find_parser(in_stack_00000028,in_stack_00000020);
  free(in_RDI);
  if (t->name == (char *)0x0) {
    mpca_root((mpc_parser_t *)0x29d6ff);
    local_8 = mpca_state((mpc_parser_t *)0x29d707);
  }
  else {
    mpca_add_tag(in_RSI,(char *)t);
    mpca_root((mpc_parser_t *)0x29d6e7);
    local_8 = mpca_state((mpc_parser_t *)0x29d6ef);
  }
  return local_8;
}

Assistant:

static mpc_val_t *mpcaf_grammar_id(mpc_val_t *x, void *s) {

  mpca_grammar_st_t *st = s;
  mpc_parser_t *p = mpca_grammar_find_parser(x, st);
  free(x);

  if (p->name) {
    return mpca_state(mpca_root(mpca_add_tag(p, p->name)));
  } else {
    return mpca_state(mpca_root(p));
  }
}